

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailureTest.cpp
# Opt level: O3

void __thiscall
TEST_MockFailureTest_MockUnexpectedUnmodifiedOutputParameterFailure_TestShell::
~TEST_MockFailureTest_MockUnexpectedUnmodifiedOutputParameterFailure_TestShell
          (TEST_MockFailureTest_MockUnexpectedUnmodifiedOutputParameterFailure_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockFailureTest, MockUnexpectedUnmodifiedOutputParameterFailure)
{
    int out1;
    call1->withName("foo").withOutputParameterReturning("boo", &out1, sizeof(out1));
    call2->withName("foo").withUnmodifiedOutputParameter("boo");
    call3->withName("unrelated");
    addThreeCallsToList();

    MockNamedValue actualParameter("bar");
    actualParameter.setValue((void *)0x123);

    MockUnexpectedOutputParameterFailure failure(UtestShell::getCurrent(), "foo", actualParameter, *list);
    STRCMP_EQUAL("Mock Failure: Unexpected output parameter name to function \"foo\": bar\n"
                 "\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n"
                 "\t\tfoo -> const void* boo: <output> (expected 1 call, called 0 times)\n"
                 "\t\tfoo -> const void* boo: <output> (expected 1 call, called 0 times)\n"
                 "\tEXPECTED calls that WERE fulfilled related to function: foo\n"
                 "\t\t<none>\n"
                 "\tACTUAL unexpected output parameter passed to function: foo\n"
                 "\t\tvoid* bar", failure.getMessage().asCharString());
}